

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O3

pair<const_char_*,_bool> jsoncons::uri::is_pchar(iterator first,iterator last)

{
  byte ch;
  bool bVar1;
  assertion_error *this;
  undefined8 extraout_RDX;
  undefined7 uVar3;
  undefined8 uVar2;
  iterator pvVar4;
  pair<const_char_*,_bool> pVar5;
  string local_40;
  
  if (first == last) {
    this = (assertion_error *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"assertion \'first != last\' failed at  <> :0","");
    assertion_error::assertion_error(this,&local_40);
    __cxa_throw(this,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ch = *first;
  bVar1 = is_unreserved(ch);
  uVar3 = (undefined7)((ulong)extraout_RDX >> 8);
  if (bVar1) {
    pvVar4 = first + 1;
  }
  else {
    if (((((long)last - (long)first < 3) || (*first != '%')) || (0x36 < (byte)first[1] - 0x30)) ||
       ((((0x7e0000007e03ffU >> ((ulong)((byte)first[1] - 0x30) & 0x3f) & 1) == 0 ||
         (0x36 < (byte)first[2] - 0x30)) ||
        ((0x7e0000007e03ffU >> ((ulong)((byte)first[2] - 0x30) & 0x3f) & 1) == 0)))) {
      pvVar4 = first + 1;
      uVar2 = CONCAT71(uVar3,(ch == 0x40 || ch == 0x3a) |
                             (byte)(0x28001fd200000000 >> (ch & 0x3f)) & ch < 0x3e);
      goto LAB_00450767;
    }
    pvVar4 = first + 3;
  }
  uVar2 = CONCAT71(uVar3,1);
LAB_00450767:
  pVar5._8_8_ = uVar2;
  pVar5.first = pvVar4;
  return pVar5;
}

Assistant:

static std::pair<string_view::const_iterator,bool> is_pchar(string_view::iterator first, string_view::iterator last)
        {
            JSONCONS_ASSERT(first != last);
            
            const char c = *first;
            if (is_unreserved(c))
            {
                return std::pair<string_view::const_iterator,bool>{first+1,true};
            }
            auto result = is_pct_encoded(first,last);
            if (result.second)
            {
                return result;
            }
            
            return std::pair<string_view::const_iterator,bool>{first+1,is_sub_delim(c) || c == ':' || c == '@'};
        }